

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  idx_t iVar2;
  SelectionVector *pSVar3;
  idx_t i;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t local_60;
  
  iVar4 = 0;
  local_60 = 0;
  iVar6 = 0;
  do {
    if (count == iVar4) {
      return local_60;
    }
    iVar5 = iVar4;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)result_sel->sel_vector[iVar4];
    }
    iVar2 = iVar4;
    if (lsel->sel_vector != (sel_t *)0x0) {
      iVar2 = (idx_t)lsel->sel_vector[iVar4];
    }
    iVar7 = iVar4;
    if (rsel->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)rsel->sel_vector[iVar4];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&lvalidity->super_TemplatedValidityMask<unsigned_long>,iVar2);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&rvalidity->super_TemplatedValidityMask<unsigned_long>,iVar7);
      if (!bVar1) goto LAB_013fdef5;
      bVar1 = GreaterThanEquals::Operation<duckdb::interval_t>(ldata + iVar2,rdata + iVar7);
      if (!bVar1) goto LAB_013fdef5;
      iVar2 = local_60;
      pSVar3 = true_sel;
      iVar7 = iVar6;
      local_60 = local_60 + 1;
    }
    else {
LAB_013fdef5:
      iVar7 = iVar6 + 1;
      iVar2 = iVar6;
      pSVar3 = false_sel;
    }
    pSVar3->sel_vector[iVar2] = (sel_t)iVar5;
    iVar4 = iVar4 + 1;
    iVar6 = iVar7;
  } while( true );
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}